

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::getTimingTagsMemcpy
          (CLIntercept *this,char *functionName,cl_command_queue queue,cl_bool blocking,void *dst,
          void *src,size_t size,string *hostTag,string *deviceTag)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  undefined8 uVar8;
  _Rb_tree_header *p_Var9;
  cl_platform_id platform;
  cl_device_id local_170;
  cl_bool local_164;
  int local_160 [2];
  pthread_mutex_t *local_158;
  char *local_150;
  void *local_148;
  void *local_140;
  undefined1 local_138 [264];
  
  local_158 = (pthread_mutex_t *)&this->m_Mutex;
  local_164 = blocking;
  local_150 = functionName;
  local_148 = src;
  local_140 = dst;
  iVar4 = pthread_mutex_lock(local_158);
  if (iVar4 == 0) {
    local_170 = (cl_device_id)0x0;
    (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,&local_170,(size_t *)0x0);
    local_138._0_8_ = (cl_platform_id)0x0;
    (*(this->m_Dispatch).clGetDeviceInfo)(local_170,0x1031,8,local_138,(size_t *)0x0);
    uVar8 = local_138._0_8_;
    p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0;
        p_Var5 = (&p_Var5->_M_left)[*(cl_platform_id *)(p_Var5 + 1) < (ulong)local_138._0_8_]) {
      if (*(cl_platform_id *)(p_Var5 + 1) >= (ulong)local_138._0_8_) {
        p_Var6 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var5 = p_Var6, (ulong)local_138._0_8_ < *(cl_platform_id *)(p_Var6 + 1))) {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 == p_Var1) {
      local_138._0_8_ = (cl_platform_id)0x0;
      pmVar7 = std::
               map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
               ::at(&this->m_DispatchX,(key_type *)local_138);
    }
    else {
      pmVar7 = (mapped_type *)&p_Var5[1]._M_parent;
    }
    if (pmVar7->clGetMemAllocInfoINTEL ==
        (_func_cl_int_cl_context_void_ptr_cl_mem_info_intel_size_t_void_ptr_size_t_ptr *)0x0) {
      local_138._0_8_ = (cl_platform_id)(local_138 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,"clGetMemAllocInfoINTEL","");
      getExtensionFunctionAddress(this,(cl_platform_id)uVar8,(string *)local_138);
      if ((cl_platform_id)local_138._0_8_ != (cl_platform_id)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_);
      }
    }
    p_Var5 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
        p_Var5 = (&p_Var5->_M_left)[*(cl_platform_id *)(p_Var5 + 1) < (ulong)uVar8]) {
      if (*(cl_platform_id *)(p_Var5 + 1) >= (ulong)uVar8) {
        p_Var6 = p_Var5;
      }
    }
    p_Var9 = p_Var1;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var9 = (_Rb_tree_header *)p_Var6,
       (ulong)uVar8 < (cl_platform_id)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
      p_Var9 = p_Var1;
    }
    if (p_Var9 == p_Var1) {
      local_138._0_8_ = (cl_platform_id)0x0;
      pmVar7 = std::
               map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
               ::at(&this->m_DispatchX,(key_type *)local_138);
    }
    else {
      pmVar7 = (mapped_type *)(p_Var9 + 1);
    }
    if (pmVar7->clGetMemAllocInfoINTEL !=
        (_func_cl_int_cl_context_void_ptr_cl_mem_info_intel_size_t_void_ptr_size_t_ptr *)0x0) {
      local_170 = (cl_device_id)0x0;
      (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1090,8,&local_170,(size_t *)0x0);
      if (local_170 != (cl_device_id)0x0) {
        local_160[1] = 0x4196;
        (*pmVar7->clGetMemAllocInfoINTEL)
                  ((cl_context)local_170,local_140,0x419a,4,local_160 + 1,(size_t *)0x0);
        local_160[0] = 0x4196;
        (*pmVar7->clGetMemAllocInfoINTEL)
                  ((cl_context)local_170,local_148,0x419a,4,local_160,(size_t *)0x0);
        std::__cxx11::string::append((char *)hostTag);
        std::__cxx11::string::append((char *)hostTag);
        std::__cxx11::string::reserve((ulong)deviceTag);
        pcVar3 = local_150;
        pcVar2 = (char *)deviceTag->_M_string_length;
        strlen(local_150);
        std::__cxx11::string::_M_replace((ulong)deviceTag,0,pcVar2,(ulong)pcVar3);
        std::__cxx11::string::append((char *)deviceTag);
        std::__cxx11::string::_M_append((char *)deviceTag,(ulong)(hostTag->_M_dataplus)._M_p);
        if ((size != 0) && ((this->m_Config).DevicePerformanceTimeTransferTracking == true)) {
          snprintf(local_138,0x100,"; %zu bytes");
          std::__cxx11::string::append((char *)deviceTag);
        }
        std::__cxx11::string::append((char *)deviceTag);
      }
    }
    if (local_164 == 1) {
      std::__cxx11::string::append((char *)hostTag);
    }
    pthread_mutex_unlock(local_158);
    return;
  }
  uVar8 = std::__throw_system_error(iVar4);
  pthread_mutex_unlock(local_158);
  _Unwind_Resume(uVar8);
}

Assistant:

void CLIntercept::getTimingTagsMemcpy(
    const char* functionName,
    const cl_command_queue queue,
    const cl_bool blocking,
    const void* dst,
    const void* src,
    const size_t size,
    std::string& hostTag,
    std::string& deviceTag )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_platform_id  platform = getPlatform(queue);

    // If we don't have a function pointer for clGetMemAllocINFO, try to
    // get one.  It's possible that the function pointer exists but
    // the application hasn't queried for it yet, in which case it won't
    // be installed into the dispatch table.
    if( dispatchX(platform).clGetMemAllocInfoINTEL == NULL )
    {
        getExtensionFunctionAddress(
            platform,
            "clGetMemAllocInfoINTEL" );
    }

    const auto& dispatchX = this->dispatchX(platform);
    if( dispatchX.clGetMemAllocInfoINTEL != NULL )
    {
        cl_context  context = NULL;
        dispatch().clGetCommandQueueInfo(
            queue,
            CL_QUEUE_CONTEXT,
            sizeof( context ),
            &context,
            NULL );

        if( context )
        {
            cl_unified_shared_memory_type_intel dstType = CL_MEM_TYPE_UNKNOWN_INTEL;
            dispatchX.clGetMemAllocInfoINTEL(
                context,
                dst,
                CL_MEM_ALLOC_TYPE_INTEL,
                sizeof(dstType),
                &dstType,
                NULL );
            cl_unified_shared_memory_type_intel srcType = CL_MEM_TYPE_UNKNOWN_INTEL;
            dispatchX.clGetMemAllocInfoINTEL(
                context,
                src,
                CL_MEM_ALLOC_TYPE_INTEL,
                sizeof(srcType),
                &srcType,
                NULL );
            switch( srcType )
            {
            case CL_MEM_TYPE_DEVICE_INTEL:  hostTag += "Dto"; break;
            case CL_MEM_TYPE_HOST_INTEL:    hostTag += "Hto"; break;
            case CL_MEM_TYPE_SHARED_INTEL:  hostTag += "Sto"; break;
            default:                        hostTag += "Mto"; break;
            }
            switch( dstType )
            {
            case CL_MEM_TYPE_DEVICE_INTEL:  hostTag += "D"; break;
            case CL_MEM_TYPE_HOST_INTEL:    hostTag += "H"; break;
            case CL_MEM_TYPE_SHARED_INTEL:  hostTag += "S"; break;
            default:                        hostTag += "M"; break;
            }

            deviceTag.reserve(128);
            deviceTag = functionName;
            deviceTag += "( ";
            deviceTag += hostTag;
            if( size && config().DevicePerformanceTimeTransferTracking )
            {
                char    s[256];
                CLI_SPRINTF( s, 256, "; %zu bytes", size );
                deviceTag += s;
            }
            deviceTag += " )";
        }
    }

    if( blocking == CL_TRUE )
    {
        hostTag += "; blocking";
    }
}